

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O2

void signed_long(void)

{
  long i;
  stringstream ss;
  Assert local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  long local_198;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  local_198 = 0x2bcdef12;
  std::__cxx11::stringstream::stringstream(local_190);
  local_1b8._M_dataplus._M_p = (pointer)&local_198;
  UnitTests::stream_any_details::operator<<(local_180,(outputter<long> *)&local_1b8);
  local_1c8.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1c8.m_line = 0x4b;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[10],std::__cxx11::string>
            (&local_1c8,(char (*) [10])"734916370",&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

TEST(signed_long)
{
    auto i  = 0x2bcdef12L;
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(i);
    ASSERT_EQUALS("734916370", ss.str());
}